

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O2

Amap_Gat_t * Amap_LibFindGate(Amap_Lib_t *p,uint uTruth)

{
  Amap_Gat_t *pAVar1;
  int i;
  
  i = 0;
  while( true ) {
    if (p->vSorted->nSize <= i) {
      return (Amap_Gat_t *)0x0;
    }
    pAVar1 = (Amap_Gat_t *)Vec_PtrEntry(p->vSorted,i);
    if ((((pAVar1 != (Amap_Gat_t *)0x0) && (pAVar1->pFunc != (uint *)0x0)) &&
        (*(uint *)&pAVar1->field_0x38 < 0x6000000)) && (*pAVar1->pFunc == uTruth)) break;
    i = i + 1;
  }
  return pAVar1;
}

Assistant:

Amap_Gat_t * Amap_LibFindGate( Amap_Lib_t * p, unsigned uTruth )
{
    Amap_Gat_t * pGate;
    int i;
    Vec_PtrForEachEntry( Amap_Gat_t *, p->vSorted, pGate, i )
    {
        if (( pGate == NULL ) || ( pGate->pFunc == NULL )) continue;
        if ( pGate->nPins <= 5 && pGate->pFunc[0] == uTruth )
            return pGate;
    }
    return NULL;
}